

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O3

bool __thiscall
wasm::DAE::refineReturnTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  pointer ppCVar1;
  Type TVar2;
  pointer ppCVar3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  HeapType *this_00;
  Signature SVar4;
  Signature SVar5;
  HeapType local_30;
  
  TVar2.id = (uintptr_t)LUB::getResultsLUB(func,module);
  if (TVar2.id != 1) {
    this_00 = &func->type;
    SVar4 = HeapType::getSignature(this_00);
    if (TVar2.id != SVar4.results.id.id) {
      SVar5 = HeapType::getSignature(this_00);
      SVar4.results.id = TVar2.id;
      SVar4.params.id = SVar5.params.id.id;
      HeapType::HeapType(&local_30,SVar4);
      this_00->id = local_30.id;
      ppCVar1 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar3 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
          ppCVar3 = ppCVar3 + 1) {
        if (((*ppCVar3)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id
            != 1) {
          ((*ppCVar3)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
               TVar2.id;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool refineReturnTypes(Function* func,
                         const std::vector<Call*>& calls,
                         Module* module) {
    auto lub = LUB::getResultsLUB(func, *module);
    if (!lub.noted()) {
      return false;
    }
    auto newType = lub.getLUB();
    if (newType != func->getResults()) {
      func->setResults(newType);
      for (auto* call : calls) {
        if (call->type != Type::unreachable) {
          call->type = newType;
        }
      }
      return true;
    }
    return false;
  }